

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D64.cpp
# Opt level: O0

void __thiscall Storage::Disk::D64::D64(D64 *this,string *file_name)

{
  bool bVar1;
  stat *psVar2;
  undefined4 *puVar3;
  reference pcVar4;
  int iVar5;
  char *character;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *file_name_local;
  D64 *this_local;
  
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__D64_00caa140;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  psVar2 = FileHolder::stats(&this->file_);
  if (psVar2->st_size != 0x2ab00) {
    psVar2 = FileHolder::stats(&this->file_);
    if (psVar2->st_size != 0x30000) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xfffffffe;
      __cxa_throw(puVar3,&Error::typeinfo,0);
    }
  }
  psVar2 = FileHolder::stats(&this->file_);
  iVar5 = 0x28;
  if (psVar2->st_size == 0x2ab00) {
    iVar5 = 0x23;
  }
  this->number_of_tracks_ = iVar5;
  this->disk_id_ = 0;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  character = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&character);
    if (!bVar1) break;
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    this->disk_id_ = this->disk_id_ ^ (short)*pcVar4;
    this->disk_id_ = this->disk_id_ << 2 ^ (ushort)((int)(uint)this->disk_id_ >> 0xd);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

D64::D64(const std::string &file_name) :
		file_(file_name) {
	// in D64, this is it for validation without imposing potential false-negative tests: check that
	// the file size appears to be correct. Stone-age stuff.
	if(file_.stats().st_size != 174848 && file_.stats().st_size != 196608)
		throw Error::InvalidFormat;

	number_of_tracks_ = (file_.stats().st_size == 174848) ? 35 : 40;

	// then, ostensibly, this is a valid file. Hmmm. Pick a disk ID as a function of the file_name,
	// being the most stable thing available
	disk_id_ = 0;
	for(const auto &character: file_name) {
		disk_id_ ^= character;
		disk_id_ = uint16_t((disk_id_ << 2) ^ (disk_id_ >> 13));
	}
}